

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void VP8LDspInit_body(void)

{
  int iVar1;
  
  VP8LPredictors[0] = VP8LPredictor0_C;
  VP8LPredictors[1] = VP8LPredictor1_C;
  VP8LPredictors[2] = VP8LPredictor2_C;
  VP8LPredictors[3] = VP8LPredictor3_C;
  VP8LPredictors[4] = VP8LPredictor4_C;
  VP8LPredictors[5] = VP8LPredictor5_C;
  VP8LPredictors[6] = VP8LPredictor6_C;
  VP8LPredictors[7] = VP8LPredictor7_C;
  VP8LPredictors[8] = VP8LPredictor8_C;
  VP8LPredictors[9] = VP8LPredictor9_C;
  VP8LPredictors[10] = VP8LPredictor10_C;
  VP8LPredictors[0xb] = VP8LPredictor11_C;
  VP8LPredictors[0xc] = VP8LPredictor12_C;
  VP8LPredictors[0xd] = VP8LPredictor13_C;
  VP8LPredictors[0xe] = VP8LPredictor0_C;
  VP8LPredictors[0xf] = VP8LPredictor0_C;
  VP8LPredictorsAdd[0] = PredictorAdd0_C;
  VP8LPredictorsAdd[1] = PredictorAdd1_C;
  VP8LPredictorsAdd[2] = PredictorAdd2_C;
  VP8LPredictorsAdd[3] = PredictorAdd3_C;
  VP8LPredictorsAdd[4] = PredictorAdd4_C;
  VP8LPredictorsAdd[5] = PredictorAdd5_C;
  VP8LPredictorsAdd[6] = PredictorAdd6_C;
  VP8LPredictorsAdd[7] = PredictorAdd7_C;
  VP8LPredictorsAdd[8] = PredictorAdd8_C;
  VP8LPredictorsAdd[9] = PredictorAdd9_C;
  VP8LPredictorsAdd[10] = PredictorAdd10_C;
  VP8LPredictorsAdd[0xb] = PredictorAdd11_C;
  VP8LPredictorsAdd[0xc] = PredictorAdd12_C;
  VP8LPredictorsAdd[0xd] = PredictorAdd13_C;
  VP8LPredictorsAdd[0xe] = PredictorAdd0_C;
  VP8LPredictorsAdd[0xf] = PredictorAdd0_C;
  VP8LPredictorsAdd_C[0] = PredictorAdd0_C;
  VP8LPredictorsAdd_C[1] = PredictorAdd1_C;
  VP8LPredictorsAdd_C[2] = PredictorAdd2_C;
  VP8LPredictorsAdd_C[3] = PredictorAdd3_C;
  VP8LPredictorsAdd_C[4] = PredictorAdd4_C;
  VP8LPredictorsAdd_C[5] = PredictorAdd5_C;
  VP8LPredictorsAdd_C[6] = PredictorAdd6_C;
  VP8LPredictorsAdd_C[7] = PredictorAdd7_C;
  VP8LPredictorsAdd_C[8] = PredictorAdd8_C;
  VP8LPredictorsAdd_C[9] = PredictorAdd9_C;
  VP8LPredictorsAdd_C[10] = PredictorAdd10_C;
  VP8LPredictorsAdd_C[0xb] = PredictorAdd11_C;
  VP8LPredictorsAdd_C[0xc] = PredictorAdd12_C;
  VP8LPredictorsAdd_C[0xd] = PredictorAdd13_C;
  VP8LPredictorsAdd_C[0xe] = PredictorAdd0_C;
  VP8LPredictorsAdd_C[0xf] = PredictorAdd0_C;
  VP8LAddGreenToBlueAndRed = VP8LAddGreenToBlueAndRed_C;
  VP8LTransformColorInverse = VP8LTransformColorInverse_C;
  VP8LConvertBGRAToRGBA = VP8LConvertBGRAToRGBA_C;
  VP8LConvertBGRAToRGB = VP8LConvertBGRAToRGB_C;
  VP8LConvertBGRAToBGR = VP8LConvertBGRAToBGR_C;
  VP8LConvertBGRAToRGBA4444 = VP8LConvertBGRAToRGBA4444_C;
  VP8LConvertBGRAToRGB565 = VP8LConvertBGRAToRGB565_C;
  VP8LMapColor32b = MapARGB_C;
  VP8LMapColor8b = MapAlpha_C;
  if ((VP8GetCPUInfo != (VP8CPUInfo)0x0) && (iVar1 = (*VP8GetCPUInfo)(kSSE2), iVar1 != 0)) {
    VP8LDspInitSSE2();
    iVar1 = (*VP8GetCPUInfo)(kSSE4_1);
    if (iVar1 != 0) {
      VP8LDspInitSSE41();
      iVar1 = (*VP8GetCPUInfo)(kAVX2);
      if (iVar1 != 0) {
        VP8LDspInitAVX2();
      }
    }
  }
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(VP8LDspInit) {
  COPY_PREDICTOR_ARRAY(VP8LPredictor, VP8LPredictors)
  COPY_PREDICTOR_ARRAY(PredictorAdd, VP8LPredictorsAdd)
  COPY_PREDICTOR_ARRAY(PredictorAdd, VP8LPredictorsAdd_C)

#if !WEBP_NEON_OMIT_C_CODE
  VP8LAddGreenToBlueAndRed = VP8LAddGreenToBlueAndRed_C;

  VP8LTransformColorInverse = VP8LTransformColorInverse_C;

  VP8LConvertBGRAToRGBA = VP8LConvertBGRAToRGBA_C;
  VP8LConvertBGRAToRGB = VP8LConvertBGRAToRGB_C;
  VP8LConvertBGRAToBGR = VP8LConvertBGRAToBGR_C;
#endif

  VP8LConvertBGRAToRGBA4444 = VP8LConvertBGRAToRGBA4444_C;
  VP8LConvertBGRAToRGB565 = VP8LConvertBGRAToRGB565_C;

  VP8LMapColor32b = MapARGB_C;
  VP8LMapColor8b = MapAlpha_C;

  // If defined, use CPUInfo() to overwrite some pointers with faster versions.
  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      VP8LDspInitSSE2();
#if defined(WEBP_HAVE_SSE41)
      if (VP8GetCPUInfo(kSSE4_1)) {
        VP8LDspInitSSE41();
#if defined(WEBP_HAVE_AVX2)
        if (VP8GetCPUInfo(kAVX2)) {
          VP8LDspInitAVX2();
        }
#endif
      }
#endif
    }
#endif
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      VP8LDspInitMIPSdspR2();
    }
#endif
#if defined(WEBP_USE_MSA)
    if (VP8GetCPUInfo(kMSA)) {
      VP8LDspInitMSA();
    }
#endif
  }

#if defined(WEBP_HAVE_NEON)
  if (WEBP_NEON_OMIT_C_CODE ||
      (VP8GetCPUInfo != NULL && VP8GetCPUInfo(kNEON))) {
    VP8LDspInitNEON();
  }
#endif

  assert(VP8LAddGreenToBlueAndRed != NULL);
  assert(VP8LTransformColorInverse != NULL);
  assert(VP8LConvertBGRAToRGBA != NULL);
  assert(VP8LConvertBGRAToRGB != NULL);
  assert(VP8LConvertBGRAToBGR != NULL);
  assert(VP8LConvertBGRAToRGBA4444 != NULL);
  assert(VP8LConvertBGRAToRGB565 != NULL);
  assert(VP8LMapColor32b != NULL);
  assert(VP8LMapColor8b != NULL);
}